

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall
RTree::get_Range_Search_JSON
          (RTree *this,vector<Polygon_*,_std::allocator<Polygon_*>_> *data,string *json)

{
  ulong uVar1;
  vector<Point,_std::allocator<Point>_> dat;
  ulong local_98;
  _Vector_base<Point,_std::allocator<Point>_> local_88;
  string local_70;
  string local_50;
  
  std::__cxx11::string::append((char *)json);
  local_98 = 0;
  while( true ) {
    if ((ulong)((long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= local_98) break;
    std::__cxx11::string::append((char *)json);
    std::__cxx11::string::append((char *)json);
    std::__cxx11::string::append((char *)json);
    Polygon::get_vertices
              ((vector<Point,_std::allocator<Point>_> *)&local_88,
               (data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
               super__Vector_impl_data._M_start[local_98]);
    uVar1 = 0;
    while (uVar1 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3)) {
      std::__cxx11::string::append((char *)json);
      std::__cxx11::to_string(&local_70,local_88._M_impl.super__Vector_impl_data._M_start[uVar1].X);
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)json);
      std::__cxx11::to_string(&local_70,local_88._M_impl.super__Vector_impl_data._M_start[uVar1].Y);
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)json);
      uVar1 = uVar1 + 1;
      if (uVar1 != (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3) {
        std::__cxx11::string::append((char *)json);
      }
    }
    std::__cxx11::string::append((char *)json);
    std::__cxx11::to_string(&local_50,0);
    std::operator+(&local_70,"\"level\":",&local_50);
    std::__cxx11::string::append((string *)json);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)json);
    std::__cxx11::string::append((char *)json);
    local_98 = local_98 + 1;
    if ((long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != local_98) {
      std::__cxx11::string::append((char *)json);
    }
    std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_88);
  }
  std::__cxx11::string::append((char *)json);
  return;
}

Assistant:

void RTree::get_Range_Search_JSON(const std::vector<Polygon *> & data, std::string &json){
    json += "[";
    for(int i=0; i<data.size(); i++){
        json +="[";
        json +="{";
        json +="\"elements\":[";    
        auto dat = data[i]->get_vertices();
        for(int j = 0; j < dat.size(); j++){
            json +="[";  
            
            json += std::to_string(dat[j].get_X());
            json += ",";
            json += std::to_string(dat[j].get_Y()); 
        
            json +="]";
            if((j+1) != dat.size())
                    json +=",";
        }            
    
        json +="],";
        json+="\"level\":"+std::to_string(0);
        json += "}";

        json +="]";
        if((i+1) != data.size())
            json +=",\n";
    }
    json += "]";
}